

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O3

void __thiscall
absl::lts_20240722::cord_internal::CordzInfo::CordzInfo
          (CordzInfo *this,CordRep *rep,CordzInfo *src,MethodIdentifier method,
          int64_t sampling_stride)

{
  Counter *pCVar1;
  long lVar2;
  int i;
  int iVar3;
  MethodIdentifier MVar4;
  long lVar5;
  size_t sVar6;
  void **__src;
  size_t *psVar7;
  Duration DVar8;
  
  absl::lts_20240722::cord_internal::CordzHandle::CordzHandle(&this->super_CordzHandle,false);
  *(undefined ***)this = &PTR__CordzInfo_00106b98;
  this->list_ = (List *)global_list_;
  (this->ci_prev_)._M_b._M_p = (__pointer_type)0x0;
  (this->ci_next_)._M_b._M_p = (__pointer_type)0x0;
  (this->mutex_).mu_.super___atomic_base<long>._M_i = 0;
  this->rep_ = rep;
  iVar3 = absl::lts_20240722::GetStackTrace(this->stack_,0x40,1);
  this->stack_depth_ = (long)iVar3;
  if (src == (CordzInfo *)0x0) {
    this->parent_stack_depth_ = 0;
    this->method_ = method;
    MVar4 = kUnknown;
  }
  else {
    sVar6 = src->parent_stack_depth_;
    if (sVar6 == 0) {
      __src = src->stack_;
      psVar7 = &src->stack_depth_;
      sVar6 = src->stack_depth_;
    }
    else {
      psVar7 = &src->parent_stack_depth_;
      __src = src->parent_stack_;
    }
    memcpy(this->parent_stack_,__src,sVar6 << 3);
    this->parent_stack_depth_ = *psVar7;
    this->method_ = method;
    MVar4 = src->parent_method_;
    if (MVar4 == kUnknown) {
      MVar4 = src->method_;
    }
  }
  this->parent_method_ = MVar4;
  memset(&this->update_tracker_,0,200);
  DVar8 = (Duration)absl::lts_20240722::Now();
  (this->create_time_).rep_ = DVar8;
  this->sampling_stride_ = sampling_stride;
  pCVar1 = (this->update_tracker_).values_ + method;
  (pCVar1->super_atomic<long>).super___atomic_base<long>._M_i =
       (pCVar1->super_atomic<long>).super___atomic_base<long>._M_i + 1;
  if (src != (CordzInfo *)0x0) {
    lVar5 = 0;
    do {
      lVar2 = (src->update_tracker_).values_[lVar5].super_atomic<long>.super___atomic_base<long>.
              _M_i;
      if (lVar2 != 0) {
        pCVar1 = (this->update_tracker_).values_ + lVar5;
        (pCVar1->super_atomic<long>).super___atomic_base<long>._M_i =
             (pCVar1->super_atomic<long>).super___atomic_base<long>._M_i + lVar2;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x19);
  }
  return;
}

Assistant:

CordzInfo::CordzInfo(CordRep* rep, const CordzInfo* src,
                     MethodIdentifier method, int64_t sampling_stride)
    : rep_(rep),
      stack_depth_(
          static_cast<size_t>(absl::GetStackTrace(stack_,
                                                  /*max_depth=*/kMaxStackDepth,
                                                  /*skip_count=*/1))),
      parent_stack_depth_(FillParentStack(src, parent_stack_)),
      method_(method),
      parent_method_(GetParentMethod(src)),
      create_time_(absl::Now()),
      sampling_stride_(sampling_stride) {
  update_tracker_.LossyAdd(method);
  if (src) {
    // Copy parent counters.
    update_tracker_.LossyAdd(src->update_tracker_);
  }
}